

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O3

int google::protobuf::compiler::PluginMain(int argc,char **argv,CodeGenerator *generator)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  FileDescriptor *pFVar5;
  long *plVar6;
  LogMessage *other;
  ostream *poVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  string error;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  GeneratorResponseContext context;
  CodeGeneratorResponse response;
  CodeGeneratorRequest request;
  DescriptorPool pool;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  void *local_158;
  void *pvStack_150;
  long local_148;
  long *local_140 [2];
  long local_130 [2];
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  GeneratorContext local_100;
  CodeGeneratorResponse *local_f8;
  void **local_f0;
  CodeGeneratorResponse local_e8;
  CodeGeneratorRequest local_b0;
  DescriptorPool local_60;
  
  if (argc < 2) {
    CodeGeneratorRequest::CodeGeneratorRequest(&local_b0);
    bVar2 = Message::ParseFromFileDescriptor(&local_b0.super_Message,0);
    if (bVar2) {
      DescriptorPool::DescriptorPool(&local_60);
      if (0 < local_b0.proto_file_.super_RepeatedPtrFieldBase.current_size_) {
        lVar9 = 0;
        do {
          pFVar5 = DescriptorPool::BuildFile
                             (&local_60,
                              (FileDescriptorProto *)
                              local_b0.proto_file_.super_RepeatedPtrFieldBase.elements_[lVar9]);
          if (pFVar5 == (FileDescriptor *)0x0) {
            iVar3 = 1;
            goto LAB_00187433;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_b0.proto_file_.super_RepeatedPtrFieldBase.current_size_);
      }
      local_158 = (void *)0x0;
      pvStack_150 = (void *)0x0;
      local_148 = 0;
      if (0 < local_b0.file_to_generate_.super_RepeatedPtrFieldBase.current_size_) {
        lVar9 = 0;
        do {
          local_e8.super_Message.super_MessageLite._vptr_MessageLite =
               (MessageLite)
               DescriptorPool::FindFileByName
                         (&local_60,
                          (string *)
                          local_b0.file_to_generate_.super_RepeatedPtrFieldBase.elements_[lVar9]);
          std::
          vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::emplace_back<google::protobuf::FileDescriptor_const*>
                    ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)&local_158,(FileDescriptor **)&local_e8);
          if (*(long *)((long)pvStack_150 + -8) == 0) {
            pcVar1 = *argv;
            if (pcVar1 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2933e8);
            }
            else {
              sVar4 = strlen(pcVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       ": protoc asked plugin to generate a file but did not provide a descriptor for the file: "
                       ,0x58);
            if (local_b0.file_to_generate_.super_RepeatedPtrFieldBase.current_size_ <= (int)lVar9) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)&local_e8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              other = internal::LogMessage::operator<<
                                ((LogMessage *)&local_e8,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_178,other);
              internal::LogMessage::~LogMessage((LogMessage *)&local_e8);
            }
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,
                                *local_b0.file_to_generate_.super_RepeatedPtrFieldBase.elements_
                                 [lVar9],*(long *)((long)local_b0.file_to_generate_.
                                                         super_RepeatedPtrFieldBase.elements_[lVar9]
                                                  + 8));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            iVar3 = 1;
            std::ostream::flush();
            goto LAB_0018741c;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_b0.file_to_generate_.super_RepeatedPtrFieldBase.current_size_);
      }
      CodeGeneratorResponse::CodeGeneratorResponse(&local_e8);
      local_100._vptr_GeneratorContext = (_func_int **)&PTR__GeneratorContext_0028de38;
      local_f0 = &local_158;
      local_f8 = &local_e8;
      if (pvStack_150 != local_158) {
        uVar10 = 0;
        do {
          plVar6 = *(long **)((long)local_158 + uVar10 * 8);
          local_178 = &local_168;
          local_170 = 0;
          local_168 = 0;
          iVar3 = (*generator->_vptr_CodeGenerator[2])
                            (generator,plVar6,local_b0.parameter_,&local_100,&local_178);
          if ((char)iVar3 == '\0') {
            if (local_170 == 0) {
              std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)0x0,0x22e279);
              goto LAB_00186f9c;
            }
LAB_0018715a:
            plVar6 = (long *)*plVar6;
            lVar9 = *plVar6;
            local_140[0] = local_130;
            std::__cxx11::string::_M_construct<char*>((string *)local_140,lVar9,plVar6[1] + lVar9);
            std::__cxx11::string::append((char *)local_140);
            plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_140,(ulong)local_178);
            plVar8 = plVar6 + 2;
            if ((long *)*plVar6 == plVar8) {
              local_110 = *plVar8;
              lStack_108 = plVar6[3];
              local_120 = &local_110;
            }
            else {
              local_110 = *plVar8;
              local_120 = (long *)*plVar6;
            }
            local_118 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            local_e8._has_bits_[0]._0_1_ = (byte)local_e8._has_bits_[0] | 1;
            if (local_e8.error_ == (string *)internal::kEmptyString_abi_cxx11_) {
              local_e8.error_ = (string *)operator_new(0x20);
              ((local_e8.error_)->_M_dataplus)._M_p = (pointer)&(local_e8.error_)->field_2;
              (local_e8.error_)->_M_string_length = 0;
              ((local_e8.error_)->field_2)._M_local_buf[0] = '\0';
            }
            std::__cxx11::string::_M_assign((string *)local_e8.error_);
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            if (local_140[0] != local_130) {
              operator_delete(local_140[0],local_130[0] + 1);
            }
            if (local_178 != &local_168) {
              operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
            }
            break;
          }
LAB_00186f9c:
          if (local_170 != 0) goto LAB_0018715a;
          if (local_178 != &local_168) {
            operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)pvStack_150 - (long)local_158 >> 3));
      }
      bVar2 = Message::SerializeToFileDescriptor(&local_e8.super_Message,1);
      iVar3 = 0;
      if (!bVar2) {
        pcVar1 = *argv;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2933e8);
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,": Error writing to stdout.",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
        std::ostream::put(-0x18);
        iVar3 = 1;
        std::ostream::flush();
      }
      GeneratorContext::~GeneratorContext(&local_100);
      CodeGeneratorResponse::~CodeGeneratorResponse(&local_e8);
LAB_0018741c:
      if (local_158 != (void *)0x0) {
        operator_delete(local_158,local_148 - (long)local_158);
      }
LAB_00187433:
      DescriptorPool::~DescriptorPool(&local_60);
    }
    else {
      pcVar1 = *argv;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2933e8);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,": protoc sent unparseable request to plugin.",0x2c);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
      std::ostream::put(-0x18);
      iVar3 = 1;
      std::ostream::flush();
    }
    CodeGeneratorRequest::~CodeGeneratorRequest(&local_b0);
  }
  else {
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2933e8);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": Unknown option: ",0x12);
    pcVar1 = argv[1];
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2933e8);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int PluginMain(int argc, char* argv[], const CodeGenerator* generator) {

  if (argc > 1) {
    cerr << argv[0] << ": Unknown option: " << argv[1] << endl;
    return 1;
  }

#ifdef _WIN32
  _setmode(STDIN_FILENO, _O_BINARY);
  _setmode(STDOUT_FILENO, _O_BINARY);
#endif

  CodeGeneratorRequest request;
  if (!request.ParseFromFileDescriptor(STDIN_FILENO)) {
    cerr << argv[0] << ": protoc sent unparseable request to plugin." << endl;
    return 1;
  }

  DescriptorPool pool;
  for (int i = 0; i < request.proto_file_size(); i++) {
    const FileDescriptor* file = pool.BuildFile(request.proto_file(i));
    if (file == NULL) {
      // BuildFile() already wrote an error message.
      return 1;
    }
  }

  vector<const FileDescriptor*> parsed_files;
  for (int i = 0; i < request.file_to_generate_size(); i++) {
    parsed_files.push_back(pool.FindFileByName(request.file_to_generate(i)));
    if (parsed_files.back() == NULL) {
      cerr << argv[0] << ": protoc asked plugin to generate a file but "
              "did not provide a descriptor for the file: "
           << request.file_to_generate(i) << endl;
      return 1;
    }
  }

  CodeGeneratorResponse response;
  GeneratorResponseContext context(&response, parsed_files);

  for (int i = 0; i < parsed_files.size(); i++) {
    const FileDescriptor* file = parsed_files[i];

    string error;
    bool succeeded = generator->Generate(
        file, request.parameter(), &context, &error);

    if (!succeeded && error.empty()) {
      error = "Code generator returned false but provided no error "
              "description.";
    }
    if (!error.empty()) {
      response.set_error(file->name() + ": " + error);
      break;
    }
  }

  if (!response.SerializeToFileDescriptor(STDOUT_FILENO)) {
    cerr << argv[0] << ": Error writing to stdout." << endl;
    return 1;
  }

  return 0;
}